

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void * base_alloc_impl(tsdn_t *tsdn,base_t *base,size_t size,size_t alignment,size_t *esn,
                      size_t *ret_usize)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  base_t *base_00;
  base_block_t *pbVar6;
  edata_t *edata;
  ulong size_00;
  void *gap_size;
  size_t *duckdb_je_extent_sn_next;
  size_t sVar7;
  size_t *size_01;
  long lVar8;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *alignment_00;
  
  size_00 = alignment + 0xf & 0xfffffffffffffff0;
  duckdb_je_extent_sn_next = (size_t *)((size_00 + size) - 1 & -size_00);
  __mutex = (pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x48);
  size_01 = ret_usize;
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&base->mtx);
    (base->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(base->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  sVar7 = (long)duckdb_je_extent_sn_next + (size_00 - 0x10);
  if ((base->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (base->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(base->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (sVar7 < 0x1001) {
    uVar5 = (uint)duckdb_je_sz_size2index_tab[(long)duckdb_je_extent_sn_next + (size_00 - 9) >> 3];
  }
  else {
    uVar5 = sz_size2index_compute(sVar7);
  }
  if (uVar5 < 0xe8) {
    lVar8 = (ulong)uVar5 << 4;
    do {
      base_00 = (base_t *)
                duckdb_je_edata_heap_remove_first
                          ((edata_heap_t *)((long)&base->avail[0].ph.root + lVar8));
      if (base_00 != (base_t *)0x0) goto LAB_01c3aafb;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0xe80);
  }
  (base->mtx).field_0.field_0.locked.repr = false;
  alignment_00 = __mutex;
  pthread_mutex_unlock(__mutex);
  size_01 = duckdb_je_extent_sn_next;
  pbVar6 = base_block_alloc(tsdn,base,&base->ehooks_base,(int)base + 0x94,
                            (pszind_t *)&base->duckdb_je_extent_sn_next,duckdb_je_extent_sn_next,
                            size_00,(size_t)alignment_00);
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&base->mtx);
    (base->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(base->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((base->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (base->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(base->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (pbVar6 == (base_block_t *)0x0) {
    gap_size = (void *)0x0;
  }
  else {
    pbVar6->next = base->blocks;
    base->blocks = pbVar6;
    base->allocated = base->allocated + 0x90;
    sVar7 = pbVar6->size;
    base->resident = base->resident + 0x1000;
    base->mapped = sVar7 + base->mapped;
    if (((duckdb_je_opt_metadata_thp != metadata_thp_disabled) &&
        (duckdb_je_init_system_thp_mode == thp_mode_default)) &&
       ((duckdb_je_opt_metadata_thp != metadata_thp_auto || (base->auto_thp_switched == true)))) {
      base->n_thp = base->n_thp + 1;
    }
    base_00 = (base_t *)&pbVar6->edata;
LAB_01c3aafb:
    pvVar3 = (base_00->ehooks).ptr.repr;
    gap_size = (void *)((size_00 - 1) + (long)pvVar3 & -size_00);
    edata = (edata_t *)((long)gap_size - (long)pvVar3);
    (base_00->ehooks).ptr.repr = (void *)((long)gap_size + (long)duckdb_je_extent_sn_next);
    *(long *)&base_00->ehooks_base =
         *(long *)&base_00->ehooks_base - ((long)&edata->e_bits + (long)duckdb_je_extent_sn_next);
    *(ulong *)&base_00->ehooks = *(ulong *)&base_00->ehooks & 0xfffffffff0010000 | 0xe80afff;
    base_extent_bump_alloc_post
              ((tsdn_t *)base,base_00,edata,(size_t)gap_size,duckdb_je_extent_sn_next,
               (size_t)size_01);
    if (esn != (size_t *)0x0) {
      *esn = (base_00->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
    }
    if (ret_usize != (size_t *)0x0) {
      *ret_usize = (size_t)duckdb_je_extent_sn_next;
    }
  }
  (base->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return gap_size;
}

Assistant:

static void *
base_alloc_impl(tsdn_t *tsdn, base_t *base, size_t size, size_t alignment,
    size_t *esn, size_t *ret_usize) {
	alignment = QUANTUM_CEILING(alignment);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t asize = usize + alignment - QUANTUM;

	edata_t *edata = NULL;
	malloc_mutex_lock(tsdn, &base->mtx);
	for (szind_t i = sz_size2index(asize); i < SC_NSIZES; i++) {
		edata = edata_heap_remove_first(&base->avail[i]);
		if (edata != NULL) {
			/* Use existing space. */
			break;
		}
	}
	if (edata == NULL) {
		/* Try to allocate more space. */
		edata = base_extent_alloc(tsdn, base, usize, alignment);
	}
	void *ret;
	if (edata == NULL) {
		ret = NULL;
		goto label_return;
	}

	ret = base_extent_bump_alloc(tsdn, base, edata, usize, alignment);
	if (esn != NULL) {
		*esn = (size_t)edata_sn_get(edata);
	}
	if (ret_usize != NULL) {
		*ret_usize = usize;
	}
label_return:
	malloc_mutex_unlock(tsdn, &base->mtx);
	return ret;
}